

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void asm_snap_alloc(ASMState *as)

{
  ushort uVar1;
  SnapShot *pSVar2;
  SnapEntry *pSVar3;
  uint ref;
  ulong uVar4;
  ulong uVar5;
  
  pSVar2 = as->T->snap;
  uVar5 = (ulong)pSVar2[as->snapno].nent;
  if (uVar5 != 0) {
    uVar1 = pSVar2[as->snapno].mapofs;
    pSVar3 = as->T->snapmap;
    uVar4 = 0;
    do {
      ref = (uint)(ushort)pSVar3[uVar1 + uVar4];
      if (0x7fff < ref) {
        asm_snap_alloc1(as,ref);
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  return;
}

Assistant:

static void asm_snap_alloc(ASMState *as)
{
  SnapShot *snap = &as->T->snap[as->snapno];
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    IRRef ref = snap_ref(sn);
    if (!irref_isk(ref)) {
      asm_snap_alloc1(as, ref);
      if (LJ_SOFTFP && (sn & SNAP_SOFTFPNUM)) {
	lua_assert(irt_type(IR(ref+1)->t) == IRT_SOFTFP);
	asm_snap_alloc1(as, ref+1);
      }
    }
  }
}